

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void AdditionHelper<unsigned_long_long,_long,_8>::
     AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (unsigned_long_long *lhs,long *rhs,unsigned_long_long *result)

{
  uint64_t uVar1;
  ulong *in_RDX;
  long *in_RSI;
  ulong *in_RDI;
  uint64_t tmp;
  
  if (*in_RSI < 0) {
    uVar1 = AbsValueHelper<long,_1>::Abs(0x2198d4);
    if (*in_RDI < uVar1) {
LAB_00219936:
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
    *in_RDX = *in_RDI - uVar1;
  }
  else {
    if (*in_RDI + *in_RSI < *in_RDI) goto LAB_00219936;
    *in_RDX = *in_RDI + *in_RSI;
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs is std::uint64_t, rhs signed
        std::uint64_t tmp = 0;

        if( rhs < 0 )
        {
            // So we're effectively subtracting
            tmp = AbsValueHelper< U, GetAbsMethod< U >::method >::Abs( rhs );

            if( tmp <= lhs )
            {
                result = lhs - tmp;
                return;
            }
        }
        else
        {
            // now we know that rhs can be safely cast into an std::uint64_t
            tmp = (std::uint64_t)lhs + (std::uint64_t)rhs;

            // We added and it did not become smaller
            if( tmp >= lhs )
            {
                result = (T)tmp;
                return;
            }
        }

        E::SafeIntOnOverflow();
    }